

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3CloseMethod(sqlite3_vtab_cursor *pCursor)

{
  Fts3Cursor *pCsr;
  sqlite3_vtab_cursor *pCursor_local;
  
  fts3ClearCursor((Fts3Cursor *)pCursor);
  sqlite3_free(pCursor);
  return 0;
}

Assistant:

static int fts3CloseMethod(sqlite3_vtab_cursor *pCursor){
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;
  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  fts3ClearCursor(pCsr);
  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  sqlite3_free(pCsr);
  return SQLITE_OK;
}